

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ShutdownData::~ShutdownData(ShutdownData *this)

{
  pointer ppVar1;
  _func_void_void_ptr *p_Var2;
  void *pvVar3;
  pointer ppVar4;
  pointer ppVar5;
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  *__range3;
  
  ppVar4 = (this->functions).
           super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->functions).
           super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = ppVar1 + -1;
  if (ppVar4 < ppVar5 && ppVar4 != ppVar1) {
    do {
      p_Var2 = ppVar4->first;
      ppVar4->first = ppVar5->first;
      ppVar5->first = p_Var2;
      pvVar3 = ppVar4->second;
      ppVar4->second = ppVar5->second;
      ppVar5->second = pvVar3;
      ppVar4 = ppVar4 + 1;
      ppVar5 = ppVar5 + -1;
    } while (ppVar4 < ppVar5);
  }
  ppVar1 = (this->functions).
           super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->functions).
                super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    (*ppVar4->first)(ppVar4->second);
  }
  absl::lts_20250127::Mutex::Dtor(&this->mutex);
  ppVar4 = (this->functions).
           super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar4 != (pointer)0x0) {
    operator_delete(ppVar4,(long)(this->functions).
                                 super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4);
    return;
  }
  return;
}

Assistant:

~ShutdownData() {
    std::reverse(functions.begin(), functions.end());
    for (auto pair : functions) pair.first(pair.second);
  }